

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::RangeTest(IntPoint *Pt,bool *useFullRange)

{
  clipperException *this;
  bool *useFullRange_local;
  IntPoint *Pt_local;
  
  if ((*useFullRange & 1U) == 0) {
    if ((((0x3fffffff < Pt->X) || (0x3fffffff < Pt->Y)) || (0x3fffffff < -Pt->X)) ||
       (0x3fffffff < -Pt->Y)) {
      *useFullRange = true;
      RangeTest(Pt,useFullRange);
    }
  }
  else if (((0x3fffffffffffffff < Pt->X) || (0x3fffffffffffffff < Pt->Y)) ||
          ((0x3fffffffffffffff < -Pt->X || (0x3fffffffffffffff < -Pt->Y)))) {
    this = (clipperException *)__cxa_allocate_exception(0x28);
    clipperException::clipperException(this,"Coordinate outside allowed range");
    __cxa_throw(this,&clipperException::typeinfo,clipperException::~clipperException);
  }
  return;
}

Assistant:

void RangeTest(const IntPoint& Pt, bool& useFullRange)
{
  if (useFullRange)
  {
    if (Pt.X > hiRange || Pt.Y > hiRange || -Pt.X > hiRange || -Pt.Y > hiRange) 
      throw clipperException("Coordinate outside allowed range");
  }
  else if (Pt.X > loRange|| Pt.Y > loRange || -Pt.X > loRange || -Pt.Y > loRange) 
  {
    useFullRange = true;
    RangeTest(Pt, useFullRange);
  }
}